

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

UniquePtr<struct_stack_st_X509_NAME> DecodeHexX509Names(string *hex_names)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  void *__s;
  undefined8 extraout_RAX;
  _Head_base<0UL,_X509_name_st_*,_false> p;
  size_t sVar4;
  UniquePtr<struct_stack_st_X509_NAME> extraout_RAX_00;
  char *pcVar5;
  long *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar6;
  ulong uVar7;
  pointer pbVar8;
  ulong uVar9;
  UniquePtr<struct_stack_st_X509_NAME> ret;
  uint8_t high;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  der_names;
  byte local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  __uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter> local_88;
  __uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ulong local_40;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = in_RSI[1];
  local_60 = hex_names;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      if (*(char *)(*in_RSI + uVar7) == ',') {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)in_RSI);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        uVar9 = in_RSI[1];
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar9);
  }
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)in_RSI);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             &local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  local_38 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_40 = 0;
    pbVar8 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      uVar9 = pbVar8->_M_string_length;
      if ((uVar9 & 1) == 0) {
        __s = operator_new__(uVar9 >> 1);
        memset(__s,0,uVar9 >> 1);
        if (uVar9 < 2) {
          pcVar5 = (char *)0x0;
        }
        else {
          uVar9 = 0;
          do {
            iVar3 = OPENSSL_fromxdigit((uint8_t *)&local_88,
                                       (int)(pbVar8->_M_dataplus)._M_p[uVar9 * 2]);
            if ((iVar3 == 0) ||
               (iVar3 = OPENSSL_fromxdigit(&local_a9,(int)(pbVar8->_M_dataplus)._M_p[uVar9 * 2 + 1])
               , iVar3 == 0)) {
              operator_delete__(__s);
              goto LAB_00129688;
            }
            *(byte *)((long)__s + uVar9) =
                 (char)local_88._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl << 4 | local_a9;
            uVar9 = uVar9 + 1;
            pcVar5 = (char *)local_a8._M_string_length;
          } while (uVar9 < pbVar8->_M_string_length >> 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_a8,0,pcVar5,(ulong)__s);
        operator_delete__(__s);
        bVar2 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_58,&local_a8);
      }
      else {
LAB_00129688:
        DecodeHexX509Names();
        local_40 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if ((local_40 & 1) != 0) goto LAB_001296a5;
        this = &local_58;
        goto LAB_001296a0;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_38);
  }
  this = &local_78;
LAB_001296a0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
LAB_001296a5:
  local_a8._M_dataplus._M_p = (pointer)OPENSSL_sk_new_null();
  pbVar8 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((OPENSSL_STACK *)local_a8._M_dataplus._M_p == (OPENSSL_STACK *)0x0) {
    (local_60->_M_dataplus)._M_p = (pointer)0x0;
  }
  else {
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar6 = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pbVar1 = (pointer)(pbVar6->_M_dataplus)._M_p;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar1;
        p._M_head_impl =
             (X509_name_st *)
             d2i_X509_NAME((X509_NAME **)0x0,(uchar **)&local_78,pbVar6->_M_string_length);
        if (((_Head_base<0UL,_X509_name_st_*,_false>)p._M_head_impl ==
             (_Head_base<0UL,_X509_name_st_*,_false>)0x0) ||
           (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)((long)&(pbVar1->_M_dataplus)._M_p + pbVar6->_M_string_length))) {
          local_88._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
               (tuple<X509_name_st_*,_bssl::internal::Deleter>)
               (tuple<X509_name_st_*,_bssl::internal::Deleter>)p._M_head_impl;
          DecodeHexX509Names();
LAB_001297a1:
          (local_60->_M_dataplus)._M_p = (pointer)0x0;
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_88);
          goto LAB_001297b7;
        }
        local_88._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>)0x0;
        local_80._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)p._M_head_impl;
        sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)local_a8._M_dataplus._M_p,p._M_head_impl);
        if (sVar4 == 0) {
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_80);
          goto LAB_001297a1;
        }
        local_80._M_t.super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
             (tuple<X509_name_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>)0x0;
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_80);
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_88);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar8);
    }
    (local_60->_M_dataplus)._M_p = local_a8._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)0x0;
  }
LAB_001297b7:
  std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return (UniquePtr<struct_stack_st_X509_NAME>)
         extraout_RAX_00._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>.
         _M_t.super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509_NAME)> DecodeHexX509Names(
    const std::string &hex_names) {
  const std::vector<std::string> der_names = DecodeHexStrings(hex_names);
  bssl::UniquePtr<STACK_OF(X509_NAME)> ret(sk_X509_NAME_new_null());
  if (!ret) {
    return nullptr;
  }

  for (const auto &der_name : der_names) {
    const uint8_t *const data =
        reinterpret_cast<const uint8_t *>(der_name.data());
    const uint8_t *derp = data;
    bssl::UniquePtr<X509_NAME> name(
        d2i_X509_NAME(nullptr, &derp, der_name.size()));
    if (!name || derp != data + der_name.size()) {
      fprintf(stderr, "Failed to parse X509_NAME.\n");
      return nullptr;
    }

    if (!bssl::PushToStack(ret.get(), std::move(name))) {
      return nullptr;
    }
  }

  return ret;
}